

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_expression.cpp
# Opt level: O1

bool duckdb::WindowExpression::Equal(WindowExpression *a,WindowExpression *b)

{
  vector<duckdb::OrderByNode,_true> *pvVar1;
  OrderType OVar2;
  OrderByNullType OVar3;
  bool bVar4;
  int iVar5;
  const_reference pvVar6;
  pointer pPVar7;
  type pPVar8;
  size_type sVar9;
  vector<duckdb::OrderByNode,_true> *pvVar10;
  
  if ((((((a->ignore_nulls == b->ignore_nulls) && (a->distinct == b->distinct)) &&
        (bVar4 = ParsedExpression::ListEquals(&a->children,&b->children), bVar4)) &&
       ((a->start == b->start && (a->end == b->end)))) &&
      ((a->exclude_clause == b->exclude_clause &&
       ((bVar4 = ParsedExpression::Equals(&a->start_expr,&b->start_expr), bVar4 &&
        (bVar4 = ParsedExpression::Equals(&a->end_expr,&b->end_expr), bVar4)))))) &&
     ((bVar4 = ParsedExpression::Equals(&a->offset_expr,&b->offset_expr), bVar4 &&
      ((bVar4 = ParsedExpression::Equals(&a->default_expr,&b->default_expr), bVar4 &&
       ((long)(a->arg_orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(a->arg_orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_start ==
        (long)(b->arg_orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(b->arg_orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_start)))))) {
    bVar4 = (a->arg_orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
            super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (a->arg_orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
            super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_start;
    if (bVar4) {
      pvVar1 = &a->arg_orders;
      pvVar10 = &b->arg_orders;
      pvVar6 = vector<duckdb::OrderByNode,_true>::operator[](pvVar1,0);
      OVar2 = pvVar6->type;
      pvVar6 = vector<duckdb::OrderByNode,_true>::operator[](pvVar10,0);
      if (OVar2 == pvVar6->type) {
        sVar9 = 0;
        do {
          pvVar6 = vector<duckdb::OrderByNode,_true>::operator[](pvVar1,sVar9);
          OVar3 = pvVar6->null_order;
          pvVar6 = vector<duckdb::OrderByNode,_true>::operator[](pvVar10,sVar9);
          if (OVar3 != pvVar6->null_order) break;
          pvVar6 = vector<duckdb::OrderByNode,_true>::operator[](pvVar1,sVar9);
          pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->(&pvVar6->expression);
          pvVar6 = vector<duckdb::OrderByNode,_true>::operator[](pvVar10,sVar9);
          pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator*(&pvVar6->expression);
          iVar5 = (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[10])(pPVar7,pPVar8);
          if ((char)iVar5 == '\0') break;
          sVar9 = sVar9 + 1;
          bVar4 = sVar9 < (ulong)((long)(a->arg_orders).
                                        super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                        .
                                        super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(a->arg_orders).
                                        super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                        .
                                        super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4);
          if (!bVar4) goto LAB_01250efd;
          pvVar6 = vector<duckdb::OrderByNode,_true>::operator[](pvVar1,sVar9);
          OVar2 = pvVar6->type;
          pvVar6 = vector<duckdb::OrderByNode,_true>::operator[](pvVar10,sVar9);
        } while (OVar2 == pvVar6->type);
      }
      if (bVar4) {
        return false;
      }
    }
LAB_01250efd:
    bVar4 = ParsedExpression::ListEquals(&a->partitions,&b->partitions);
    if ((bVar4) &&
       ((long)(a->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(a->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_start ==
        (long)(b->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(b->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_start)) {
      bVar4 = (a->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (a->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_start;
      if (bVar4) {
        pvVar1 = &a->orders;
        pvVar10 = &b->orders;
        pvVar6 = vector<duckdb::OrderByNode,_true>::operator[](pvVar1,0);
        OVar2 = pvVar6->type;
        pvVar6 = vector<duckdb::OrderByNode,_true>::operator[](pvVar10,0);
        if (OVar2 == pvVar6->type) {
          sVar9 = 0;
          do {
            pvVar6 = vector<duckdb::OrderByNode,_true>::operator[](pvVar1,sVar9);
            OVar3 = pvVar6->null_order;
            pvVar6 = vector<duckdb::OrderByNode,_true>::operator[](pvVar10,sVar9);
            if (OVar3 != pvVar6->null_order) break;
            pvVar6 = vector<duckdb::OrderByNode,_true>::operator[](pvVar1,sVar9);
            pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->(&pvVar6->expression);
            pvVar6 = vector<duckdb::OrderByNode,_true>::operator[](pvVar10,sVar9);
            pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator*(&pvVar6->expression);
            iVar5 = (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[10])(pPVar7,pPVar8);
            if ((char)iVar5 == '\0') break;
            sVar9 = sVar9 + 1;
            bVar4 = sVar9 < (ulong)((long)(a->orders).
                                          super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                          .
                                          super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(a->orders).
                                          super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                          .
                                          super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4);
            if (!bVar4) goto LAB_01251039;
            pvVar6 = vector<duckdb::OrderByNode,_true>::operator[](pvVar1,sVar9);
            OVar2 = pvVar6->type;
            pvVar6 = vector<duckdb::OrderByNode,_true>::operator[](pvVar10,sVar9);
          } while (OVar2 == pvVar6->type);
        }
        if (bVar4) {
          return false;
        }
      }
LAB_01251039:
      bVar4 = ParsedExpression::Equals(&a->filter_expr,&b->filter_expr);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool WindowExpression::Equal(const WindowExpression &a, const WindowExpression &b) {
	// check if the child expressions are equivalent
	if (a.ignore_nulls != b.ignore_nulls) {
		return false;
	}
	if (a.distinct != b.distinct) {
		return false;
	}
	if (!ParsedExpression::ListEquals(a.children, b.children)) {
		return false;
	}
	if (a.start != b.start || a.end != b.end) {
		return false;
	}
	if (a.exclude_clause != b.exclude_clause) {
		return false;
	}
	// check if the framing expressions are equivalent
	if (!ParsedExpression::Equals(a.start_expr, b.start_expr) || !ParsedExpression::Equals(a.end_expr, b.end_expr) ||
	    !ParsedExpression::Equals(a.offset_expr, b.offset_expr) ||
	    !ParsedExpression::Equals(a.default_expr, b.default_expr)) {
		return false;
	}

	// check if the argument orderings are equivalent
	if (a.arg_orders.size() != b.arg_orders.size()) {
		return false;
	}
	for (idx_t i = 0; i < a.arg_orders.size(); i++) {
		if (a.arg_orders[i].type != b.arg_orders[i].type) {
			return false;
		}
		if (a.arg_orders[i].null_order != b.arg_orders[i].null_order) {
			return false;
		}
		if (!a.arg_orders[i].expression->Equals(*b.arg_orders[i].expression)) {
			return false;
		}
	}

	// check if the partitions are equivalent
	if (!ParsedExpression::ListEquals(a.partitions, b.partitions)) {
		return false;
	}
	// check if the orderings are equivalent
	if (a.orders.size() != b.orders.size()) {
		return false;
	}
	for (idx_t i = 0; i < a.orders.size(); i++) {
		if (a.orders[i].type != b.orders[i].type) {
			return false;
		}
		if (a.orders[i].null_order != b.orders[i].null_order) {
			return false;
		}
		if (!a.orders[i].expression->Equals(*b.orders[i].expression)) {
			return false;
		}
	}
	// check if the filter clauses are equivalent
	if (!ParsedExpression::Equals(a.filter_expr, b.filter_expr)) {
		return false;
	}

	return true;
}